

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O2

void __thiscall
Clone_componentWithImportAndChildren_Test::TestBody(Clone_componentWithImportAndChildren_Test *this)

{
  string *psVar1;
  ComponentPtr cClone;
  ComponentPtr c;
  ComponentPtr c2;
  ComponentPtr c1;
  ImportSourcePtr import;
  string asStack_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70 [3];
  string *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  undefined8 local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  string *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  string *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  string *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::ImportSource::create();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_78,"some-other-model.xml",(allocator<char> *)&local_48);
  libcellml::ImportSource::setUrl(local_18);
  std::__cxx11::string::~string(asStack_78);
  psVar1 = local_58;
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_78,"unique",(allocator<char> *)&local_48);
  libcellml::Entity::setId(psVar1);
  std::__cxx11::string::~string(asStack_78);
  psVar1 = local_58;
  std::__cxx11::string::string<std::allocator<char>>(asStack_78,"copy",(allocator<char> *)&local_48)
  ;
  libcellml::NamedEntity::setName(psVar1);
  std::__cxx11::string::~string(asStack_78);
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_78,"child_1",(allocator<char> *)&local_48);
  libcellml::NamedEntity::setName(local_28);
  std::__cxx11::string::~string(asStack_78);
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_78,"child_2",(allocator<char> *)&local_48);
  libcellml::NamedEntity::setName(local_38);
  std::__cxx11::string::~string(asStack_78);
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_58);
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_58);
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_78,"my_component_name",(allocator<char> *)&local_48);
  libcellml::Component::setSourceComponent((shared_ptr *)local_58,(string *)&local_18);
  std::__cxx11::string::~string(asStack_78);
  libcellml::Component::clone();
  local_48 = 0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  compareComponent((shared_ptr *)&local_58,(shared_ptr *)asStack_78,(shared_ptr *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  return;
}

Assistant:

TEST(Clone, componentWithImportAndChildren)
{
    auto c = libcellml::Component::create();
    auto c1 = libcellml::Component::create();
    auto c2 = libcellml::Component::create();
    auto import = libcellml::ImportSource::create();

    import->setUrl("some-other-model.xml");
    c->setId("unique");
    c->setName("copy");
    c1->setName("child_1");
    c2->setName("child_2");

    c->addComponent(c1);
    c->addComponent(c2);
    c->setSourceComponent(import, "my_component_name");

    auto cClone = c->clone();

    compareComponent(c, cClone);
}